

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

bool __thiscall CommandLineArguments::parse(CommandLineArguments *this,TestPlugin *plugin)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  char *parameterName;
  SimpleString argument;
  uint local_5c;
  SimpleString local_58;
  TestPlugin *local_48;
  SimpleString local_40;
  
  local_5c = 1;
  bVar3 = this->ac_ < 2;
  if (1 < this->ac_) {
    uVar2 = 1;
    local_48 = plugin;
    do {
      SimpleString::SimpleString(&local_40,this->av_[(int)local_5c]);
      SimpleString::SimpleString(&local_58,"-h");
      bVar1 = operator==(&local_40,&local_58);
      SimpleString::~SimpleString(&local_58);
      if (bVar1) {
        this->needHelp_ = true;
LAB_0011a808:
        uVar2 = 0;
      }
      else {
        SimpleString::SimpleString(&local_58,"-v");
        bVar1 = operator==(&local_40,&local_58);
        SimpleString::~SimpleString(&local_58);
        if (bVar1) {
          this->verbose_ = true;
        }
        else {
          SimpleString::SimpleString(&local_58,"-vv");
          bVar1 = operator==(&local_40,&local_58);
          SimpleString::~SimpleString(&local_58);
          if (bVar1) {
            this->veryVerbose_ = true;
          }
          else {
            SimpleString::SimpleString(&local_58,"-c");
            bVar1 = operator==(&local_40,&local_58);
            SimpleString::~SimpleString(&local_58);
            if (bVar1) {
              this->color_ = true;
            }
            else {
              SimpleString::SimpleString(&local_58,"-p");
              bVar1 = operator==(&local_40,&local_58);
              SimpleString::~SimpleString(&local_58);
              if (bVar1) {
                this->runTestsAsSeperateProcess_ = true;
              }
              else {
                SimpleString::SimpleString(&local_58,"-b");
                bVar1 = operator==(&local_40,&local_58);
                SimpleString::~SimpleString(&local_58);
                if (bVar1) {
                  this->reversing_ = true;
                }
                else {
                  SimpleString::SimpleString(&local_58,"-lg");
                  bVar1 = operator==(&local_40,&local_58);
                  SimpleString::~SimpleString(&local_58);
                  if (bVar1) {
                    this->listTestGroupNames_ = true;
                  }
                  else {
                    SimpleString::SimpleString(&local_58,"-ln");
                    bVar1 = operator==(&local_40,&local_58);
                    SimpleString::~SimpleString(&local_58);
                    if (bVar1) {
                      this->listTestGroupAndCaseNames_ = true;
                    }
                    else {
                      SimpleString::SimpleString(&local_58,"-ll");
                      bVar1 = operator==(&local_40,&local_58);
                      SimpleString::~SimpleString(&local_58);
                      if (bVar1) {
                        this->listTestLocations_ = true;
                      }
                      else {
                        SimpleString::SimpleString(&local_58,"-ri");
                        bVar1 = operator==(&local_40,&local_58);
                        SimpleString::~SimpleString(&local_58);
                        if (bVar1) {
                          this->runIgnored_ = true;
                        }
                        else {
                          SimpleString::SimpleString(&local_58,"-f");
                          bVar1 = operator==(&local_40,&local_58);
                          SimpleString::~SimpleString(&local_58);
                          if (bVar1) {
                            this->crashOnFail_ = true;
                          }
                          else {
                            SimpleString::SimpleString(&local_58,"-r");
                            bVar1 = SimpleString::startsWith(&local_40,&local_58);
                            SimpleString::~SimpleString(&local_58);
                            if (bVar1) {
                              setRepeatCount(this,this->ac_,this->av_,(int *)&local_5c);
                            }
                            else {
                              SimpleString::SimpleString(&local_58,"-g");
                              bVar1 = SimpleString::startsWith(&local_40,&local_58);
                              SimpleString::~SimpleString(&local_58);
                              if (bVar1) {
                                addGroupFilter(this,this->ac_,this->av_,(int *)&local_5c);
                              }
                              else {
                                SimpleString::SimpleString(&local_58,"-t");
                                bVar1 = SimpleString::startsWith(&local_40,&local_58);
                                SimpleString::~SimpleString(&local_58);
                                if (bVar1) {
                                  bVar1 = addGroupDotNameFilter
                                                    (this,this->ac_,this->av_,(int *)&local_5c);
                                  uVar2 = (uint)bVar1;
                                }
                                else {
                                  SimpleString::SimpleString(&local_58,"-sg");
                                  bVar1 = SimpleString::startsWith(&local_40,&local_58);
                                  SimpleString::~SimpleString(&local_58);
                                  if (bVar1) {
                                    addStrictGroupFilter(this,this->ac_,this->av_,(int *)&local_5c);
                                  }
                                  else {
                                    SimpleString::SimpleString(&local_58,"-xg");
                                    bVar1 = SimpleString::startsWith(&local_40,&local_58);
                                    SimpleString::~SimpleString(&local_58);
                                    if (bVar1) {
                                      addExcludeGroupFilter
                                                (this,this->ac_,this->av_,(int *)&local_5c);
                                    }
                                    else {
                                      SimpleString::SimpleString(&local_58,"-xsg");
                                      bVar1 = SimpleString::startsWith(&local_40,&local_58);
                                      SimpleString::~SimpleString(&local_58);
                                      if (bVar1) {
                                        addExcludeStrictGroupFilter
                                                  (this,this->ac_,this->av_,(int *)&local_5c);
                                      }
                                      else {
                                        SimpleString::SimpleString(&local_58,"-n");
                                        bVar1 = SimpleString::startsWith(&local_40,&local_58);
                                        SimpleString::~SimpleString(&local_58);
                                        if (bVar1) {
                                          addNameFilter(this,this->ac_,this->av_,(int *)&local_5c);
                                        }
                                        else {
                                          SimpleString::SimpleString(&local_58,"-sn");
                                          bVar1 = SimpleString::startsWith(&local_40,&local_58);
                                          SimpleString::~SimpleString(&local_58);
                                          if (bVar1) {
                                            addStrictNameFilter(this,this->ac_,this->av_,
                                                                (int *)&local_5c);
                                          }
                                          else {
                                            SimpleString::SimpleString(&local_58,"-xn");
                                            bVar1 = SimpleString::startsWith(&local_40,&local_58);
                                            SimpleString::~SimpleString(&local_58);
                                            if (bVar1) {
                                              addExcludeNameFilter
                                                        (this,this->ac_,this->av_,(int *)&local_5c);
                                            }
                                            else {
                                              SimpleString::SimpleString(&local_58,"-xsn");
                                              bVar1 = SimpleString::startsWith(&local_40,&local_58);
                                              SimpleString::~SimpleString(&local_58);
                                              if (bVar1) {
                                                addExcludeStrictNameFilter
                                                          (this,this->ac_,this->av_,(int *)&local_5c
                                                          );
                                              }
                                              else {
                                                SimpleString::SimpleString(&local_58,"-s");
                                                bVar1 = SimpleString::startsWith
                                                                  (&local_40,&local_58);
                                                SimpleString::~SimpleString(&local_58);
                                                if (bVar1) {
                                                  bVar1 = setShuffle(this,this->ac_,this->av_,
                                                                     (int *)&local_5c);
                                                  uVar2 = (uint)bVar1;
                                                }
                                                else {
                                                  SimpleString::SimpleString(&local_58,"TEST(");
                                                  bVar1 = SimpleString::startsWith
                                                                    (&local_40,&local_58);
                                                  SimpleString::~SimpleString(&local_58);
                                                  parameterName = "TEST(";
                                                  if (!bVar1) {
                                                    SimpleString::SimpleString
                                                              (&local_58,"IGNORE_TEST(");
                                                    bVar1 = SimpleString::startsWith
                                                                      (&local_40,&local_58);
                                                    SimpleString::~SimpleString(&local_58);
                                                    parameterName = "IGNORE_TEST(";
                                                    if (!bVar1) {
                                                      SimpleString::SimpleString(&local_58,"-o");
                                                      bVar1 = SimpleString::startsWith
                                                                        (&local_40,&local_58);
                                                      SimpleString::~SimpleString(&local_58);
                                                      if (bVar1) {
                                                        bVar1 = setOutputType(this,this->ac_,
                                                                              this->av_,
                                                                              (int *)&local_5c);
                                                        uVar2 = (uint)bVar1;
                                                      }
                                                      else {
                                                        SimpleString::SimpleString(&local_58,"-p");
                                                        bVar1 = SimpleString::startsWith
                                                                          (&local_40,&local_58);
                                                        SimpleString::~SimpleString(&local_58);
                                                        if (bVar1) {
                                                          uVar2 = (*local_48->_vptr_TestPlugin[7])
                                                                            (local_48,(ulong)(uint)
                                                  this->ac_,this->av_,(ulong)local_5c);
                                                  }
                                                  else {
                                                    SimpleString::SimpleString(&local_58,"-k");
                                                    bVar1 = SimpleString::startsWith
                                                                      (&local_40,&local_58);
                                                    SimpleString::~SimpleString(&local_58);
                                                    if (!bVar1) goto LAB_0011a808;
                                                    setPackageName(this,this->ac_,this->av_,
                                                                   (int *)&local_5c);
                                                  }
                                                  }
                                                  goto LAB_0011ad7e;
                                                  }
                                                  }
                                                  addTestToRunBasedOnVerboseOutput
                                                            (this,this->ac_,this->av_,
                                                             (int *)&local_5c,parameterName);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_0011ad7e:
      SimpleString::~SimpleString(&local_40);
      if ((uVar2 & 1) == 0) {
        return bVar3;
      }
      local_5c = local_5c + 1;
      bVar3 = this->ac_ <= (int)local_5c;
    } while ((int)local_5c < this->ac_);
  }
  return bVar3;
}

Assistant:

bool CommandLineArguments::parse(TestPlugin* plugin)
{
    bool correctParameters = true;
    for (int i = 1; i < ac_; i++) {
        SimpleString argument = av_[i];

        if (argument == "-h") {
            needHelp_ = true;
            correctParameters = false;
        }
        else if (argument == "-v") verbose_ = true;
        else if (argument == "-vv") veryVerbose_ = true;
        else if (argument == "-c") color_ = true;
        else if (argument == "-p") runTestsAsSeperateProcess_ = true;
        else if (argument == "-b") reversing_ = true;
        else if (argument == "-lg") listTestGroupNames_ = true;
        else if (argument == "-ln") listTestGroupAndCaseNames_ = true;
        else if (argument == "-ll") listTestLocations_ = true;
        else if (argument == "-ri") runIgnored_ = true;
        else if (argument == "-f") crashOnFail_ = true;
        else if (argument.startsWith("-r")) setRepeatCount(ac_, av_, i);
        else if (argument.startsWith("-g")) addGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-t")) correctParameters = addGroupDotNameFilter(ac_, av_, i);
        else if (argument.startsWith("-sg")) addStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xg")) addExcludeGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xsg")) addExcludeStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-n")) addNameFilter(ac_, av_, i);
        else if (argument.startsWith("-sn")) addStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xn")) addExcludeNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xsn")) addExcludeStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("-s")) correctParameters = setShuffle(ac_, av_, i);
        else if (argument.startsWith("TEST(")) addTestToRunBasedOnVerboseOutput(ac_, av_, i, "TEST(");
        else if (argument.startsWith("IGNORE_TEST(")) addTestToRunBasedOnVerboseOutput(ac_, av_, i, "IGNORE_TEST(");
        else if (argument.startsWith("-o")) correctParameters = setOutputType(ac_, av_, i);
        else if (argument.startsWith("-p")) correctParameters = plugin->parseAllArguments(ac_, av_, i);
        else if (argument.startsWith("-k")) setPackageName(ac_, av_, i);
        else correctParameters = false;

        if (correctParameters == false) {
            return false;
        }
    }
    return true;
}